

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_int.cc
# Opt level: O1

int ASN1_INTEGER_set_int64(ASN1_INTEGER *a,int64_t v)

{
  int iVar1;
  
  if (v < 0) {
    iVar1 = asn1_string_set_uint64(a,-v,2);
    if (iVar1 != 0) {
      a->type = 0x102;
    }
    return (uint)(iVar1 != 0);
  }
  iVar1 = asn1_string_set_uint64(a,v,2);
  return iVar1;
}

Assistant:

int ASN1_INTEGER_set_int64(ASN1_INTEGER *a, int64_t v) {
  if (v >= 0) {
    return ASN1_INTEGER_set_uint64(a, (uint64_t)v);
  }

  if (!ASN1_INTEGER_set_uint64(a, 0 - (uint64_t)v)) {
    return 0;
  }

  a->type = V_ASN1_NEG_INTEGER;
  return 1;
}